

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O3

pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *
__thiscall
CppMLNN::preprocess_data
          (pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           *__return_storage_ptr__,CppMLNN *this,MatrixXd *examples,VectorXd *labels)

{
  MatrixXd examples_norm;
  MatrixXd labels_mat;
  MatrixXd local_58;
  MatrixXd local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"preprocess_data",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  build_labels_matrix(&local_40,this,labels);
  normalize_examples(&local_58,this,examples);
  std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_true>
            (__return_storage_ptr__,&local_58,&local_40);
  free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

pair<MatrixXd, MatrixXd> CppMLNN::preprocess_data(const MatrixXd& examples, const VectorXd& labels) {
	cout << __FUNCTION__ << endl;

	MatrixXd labels_mat = build_labels_matrix(labels);
	MatrixXd examples_norm = normalize_examples(examples);

	return make_pair(examples_norm, labels_mat);
}